

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  clock_t cVar1;
  ostream *poVar2;
  longlong lVar3;
  clock_t cVar4;
  uint time_end;
  uint time_begin;
  stringstream local_198 [8];
  stringstream ss;
  
  std::__cxx11::stringstream::stringstream(local_198);
  create_files((stringstream *)local_198);
  cVar1 = clock();
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_699);
  lVar3 = one_thread();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  cVar4 = clock();
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6bc);
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(double)(uint)((int)cVar4 - (int)cVar1) / 1000.0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  cVar1 = clock();
  poVar2 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_6d2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,10);
  poVar2 = std::operator<<(poVar2,anon_var_dwarf_6fa);
  lVar3 = more_pthr();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,lVar3);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  cVar4 = clock();
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,10);
  poVar2 = std::operator<<(poVar2,anon_var_dwarf_710);
  poVar2 = (ostream *)
           std::ostream::operator<<(poVar2,(double)(uint)((int)cVar4 - (int)cVar1) / 1000.0);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream(local_198);
  return 0;
}

Assistant:

int main() {
    stringstream ss;

    //генерация случайных файлов
    create_files(ss);
    //

    unsigned int time_begin = clock();
    cout << "Сумма высчитанная в одном потоке: " << one_thread() << endl;
    unsigned int time_end = clock();
    cout << "Один поток посчитал сумму чисел во всех файлах за: " << (time_end - time_begin) / 1000.0 << endl;
    time_begin = clock();
    cout << "Сумма высчитанная в " << N << " потоках: " << more_pthr() << endl;
    time_end = clock();
    cout << N << " потоков посчитали сумму чисел во всех файлах за: " << (time_end - time_begin) / 1000.0 << endl;
    return 0;
}